

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_divu(TCGContext_conflict11 *tcg_ctx,TCGv_i64 ret,TCGv_i64 source1,TCGv_i64 source2)

{
  TCGTemp *ts;
  TCGv_i64 c2;
  TCGTemp *ts_00;
  uintptr_t o;
  TCGv_i64 ret_00;
  
  ts = tcg_temp_new_internal_riscv64(tcg_ctx,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)ts - (long)tcg_ctx);
  c2 = tcg_const_i64_riscv64(tcg_ctx,0);
  ts_00 = tcg_temp_new_internal_riscv64(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_setcondi_i64_riscv64(tcg_ctx,TCG_COND_EQ,ret_00,source2,0);
  tcg_gen_op2_riscv64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)ts_00,0xffffffffffffffff);
  tcg_gen_movcond_i64_riscv64
            (tcg_ctx,TCG_COND_EQ,source1,ret_00,c2,source1,(TCGv_i64)((long)ts_00 - (long)tcg_ctx));
  tcg_gen_op2_riscv64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)ts_00,1);
  tcg_gen_movcond_i64_riscv64
            (tcg_ctx,TCG_COND_EQ,source2,ret_00,c2,source2,(TCGv_i64)((long)ts_00 - (long)tcg_ctx));
  tcg_gen_divu_i64_riscv64(tcg_ctx,ret,source1,source2);
  tcg_temp_free_internal_riscv64(tcg_ctx,ts);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  tcg_temp_free_internal_riscv64(tcg_ctx,ts_00);
  return;
}

Assistant:

static void gen_divu(TCGContext *tcg_ctx, TCGv ret, TCGv source1, TCGv source2)
{
    TCGv cond1, zeroreg, resultopt1;
    cond1 = tcg_temp_new(tcg_ctx);

    zeroreg = tcg_const_tl(tcg_ctx, 0);
    resultopt1 = tcg_temp_new(tcg_ctx);

    tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, cond1, source2, 0);
    tcg_gen_movi_tl(tcg_ctx, resultopt1, (target_ulong)-1);
    tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, source1, cond1, zeroreg, source1,
            resultopt1);
    tcg_gen_movi_tl(tcg_ctx, resultopt1, (target_ulong)1);
    tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, source2, cond1, zeroreg, source2,
            resultopt1);
    tcg_gen_divu_tl(tcg_ctx, ret, source1, source2);

    tcg_temp_free(tcg_ctx, cond1);
    tcg_temp_free(tcg_ctx, zeroreg);
    tcg_temp_free(tcg_ctx, resultopt1);
}